

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

SelectionSet * __thiscall OpenMD::SelectionEvaluator::hull(SelectionEvaluator *this,int frame)

{
  SelectionSet *in_RDI;
  SelectionSet bs;
  SelectionSet *in_stack_ffffffffffffff78;
  SelectionEvaluator *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc4;
  HullFinder *in_stack_ffffffffffffffc8;
  
  createSelectionSets(in_stack_ffffffffffffffb8);
  HullFinder::findHull(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  SelectionSet::operator=((SelectionSet *)&stack0xffffffffffffffb8,in_stack_ffffffffffffff78);
  SelectionSet::~SelectionSet((SelectionSet *)0x3c1908);
  SelectionSet::parallelReduce((SelectionSet *)in_stack_ffffffffffffffc8);
  SelectionSet::~SelectionSet((SelectionSet *)0x3c1923);
  return in_RDI;
}

Assistant:

SelectionSet SelectionEvaluator::hull(int frame) {
    SelectionSet bs = createSelectionSets();

    bs = hullFinder.findHull(frame);

    return bs.parallelReduce();
  }